

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_get_num_elements(coda_cursor *cursor,long *num_elements)

{
  int iVar1;
  coda_type_array *local_70;
  char local_68 [8];
  char s [21];
  long local_48;
  int64_t var_dim;
  undefined4 uStack_38;
  int i;
  long n;
  coda_type_array *array;
  coda_type *type;
  long *num_elements_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_70 = (coda_type_array *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_70 = (coda_type_array *)(cursor->stack[cursor->n + -1].type)->definition;
  }
  array = local_70;
  if (local_70->type_class == 0) {
    *num_elements = *(long *)&local_70->num_dims;
  }
  else {
    type = (coda_type *)num_elements;
    num_elements_local = (long *)cursor;
    if (local_70->type_class != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                    ,0x343,"int coda_ascbin_cursor_get_num_elements(const coda_cursor *, long *)");
    }
    n = (long)local_70;
    if (local_70->num_elements == -1) {
      _uStack_38 = 1;
      for (var_dim._4_4_ = 0; (int)var_dim._4_4_ < *(int *)(n + 0x48);
          var_dim._4_4_ = var_dim._4_4_ + 1) {
        if (*(long *)(n + 0x50 + (long)(int)var_dim._4_4_ * 8) == -1) {
          iVar1 = coda_expression_eval_integer
                            (*(coda_expression **)(n + 0x90 + (long)(int)var_dim._4_4_ * 8),
                             (coda_cursor *)num_elements_local,&local_48);
          if (iVar1 != 0) {
            coda_add_error_message(" for dim[%d] expression",(ulong)var_dim._4_4_);
            coda_cursor_add_to_error_message((coda_cursor *)num_elements_local);
            return -1;
          }
          if (local_48 < 0) {
            coda_str64(local_48,local_68);
            coda_set_error(-300,
                           "product error detected (invalid array size - calculated array size = %s)"
                           ,local_68);
            coda_cursor_add_to_error_message((coda_cursor *)num_elements_local);
            return -1;
          }
          _uStack_38 = local_48 * _uStack_38;
        }
        else {
          _uStack_38 = *(long *)(n + 0x50 + (long)(int)var_dim._4_4_ * 8) * _uStack_38;
        }
      }
      type->format = uStack_38;
      type->retain_count = i;
    }
    else {
      *num_elements = local_70->num_elements;
    }
  }
  return 0;
}

Assistant:

int coda_ascbin_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    switch (type->type_class)
    {
        case coda_record_class:
            *num_elements = ((coda_type_record *)type)->num_fields;
            break;
        case coda_array_class:
            {
                coda_type_array *array = (coda_type_array *)type;

                if (array->num_elements != -1)
                {
                    *num_elements = array->num_elements;
                }
                else
                {
                    long n;
                    int i;

                    /* count the number of elements in array */

                    n = 1;
                    for (i = 0; i < array->num_dims; i++)
                    {
                        if (array->dim[i] == -1)
                        {
                            int64_t var_dim;

                            if (coda_expression_eval_integer(array->dim_expr[i], cursor, &var_dim) != 0)
                            {
                                coda_add_error_message(" for dim[%d] expression", i);
                                coda_cursor_add_to_error_message(cursor);
                                return -1;
                            }
                            if (var_dim < 0)
                            {
                                char s[21];

                                coda_str64(var_dim, s);
                                coda_set_error(CODA_ERROR_PRODUCT, "product error detected (invalid array size - "
                                               "calculated array size = %s)", s);
                                coda_cursor_add_to_error_message(cursor);
                                return -1;
                            }
                            n *= (long)var_dim;
                        }
                        else
                        {
                            n *= array->dim[i];
                        }
                    }
                    *num_elements = n;
                }
            }
            break;
        default:
            assert(0);
            exit(1);
    }

    return 0;
}